

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.h
# Opt level: O3

void __thiscall File::AddIncludeStmt(File *this,bool withPointyBrackets,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_48;
  
  paVar1 = &local_48.first.field_2;
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_48.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + filename->_M_string_length);
  local_48.second = withPointyBrackets;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,bool>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::_Select1st<std::pair<std::__cxx11::string_const,bool>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
              *)&this->rawIncludes,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AddIncludeStmt(bool withPointyBrackets, const std::string& filename) {
        rawIncludes.insert(std::make_pair(filename, withPointyBrackets));
    }